

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::AssertSnapEquivTTDVar_Helper
               (TTDVar v1,TTDVar v2,TTDCompareMap *compareMap,StepKind stepKind,PathEntry *next)

{
  void *h1PtrId;
  bool bVar1;
  void **ppvVar2;
  PathEntry *next_local;
  StepKind stepKind_local;
  TTDCompareMap *compareMap_local;
  TTDVar v2_local;
  TTDVar v1_local;
  
  compareMap_local = (TTDCompareMap *)v2;
  v2_local = v1;
  if ((v1 == (TTDVar)0x0) || (v2 == (TTDVar)0x0)) {
    TTDCompareMap::DiagnosticAssert(compareMap,v1 == v2);
  }
  else {
    bVar1 = Js::TaggedNumber::Is(v1);
    if ((bVar1) || (bVar1 = Js::TaggedNumber::Is(compareMap_local), bVar1)) {
      bVar1 = JsSupport::AreInlineVarsEquiv(v2_local,compareMap_local);
      TTDCompareMap::DiagnosticAssert(compareMap,bVar1);
    }
    else {
      ppvVar2 = Memory::PointerValue<void>(&v2_local);
      h1PtrId = *ppvVar2;
      ppvVar2 = Memory::PointerValue<void>(&compareMap_local);
      TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Helper
                (compareMap,(TTD_PTR_ID)h1PtrId,(TTD_PTR_ID)*ppvVar2,stepKind,next);
    }
  }
  return;
}

Assistant:

void AssertSnapEquivTTDVar_Helper(const TTDVar v1, const TTDVar v2, TTDCompareMap& compareMap, TTDComparePath::StepKind stepKind, const TTDComparePath::PathEntry& next)
        {
            if(v1 == nullptr || v2 == nullptr)
            {
                compareMap.DiagnosticAssert(v1 == v2);
            }
            else if(Js::TaggedNumber::Is(v1) || Js::TaggedNumber::Is(v2))
            {
                compareMap.DiagnosticAssert(JsSupport::AreInlineVarsEquiv(v1, v2));
            }
            else
            {
                compareMap.CheckConsistentAndAddPtrIdMapping_Helper(TTD_CONVERT_VAR_TO_PTR_ID(v1), TTD_CONVERT_VAR_TO_PTR_ID(v2), stepKind, next);
            }
        }